

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

uint8_t on_shutdown(intptr_t fd,fio_protocol_s *ws)

{
  fio_write_args_s options;
  fio_write_args_s options_00;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined1 local_20;
  undefined7 uStack_1f;
  fio_protocol_s *ws_local;
  intptr_t fd_local;
  
  if ((ws != (fio_protocol_s *)0x0) &&
     (ws[1].on_shutdown != (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0)) {
    (*ws[1].on_shutdown)((intptr_t)ws,ws);
  }
  if (*(char *)((long)&ws[3].ping + 1) == '\0') {
    options_00.after.dealloc = FIO_DEALLOC_NOOP;
    options_00.data.buffer = anon_var_dwarf_3aba5;
    options_00.length = 2;
    options_00.offset = 0;
    options_00._32_8_ = CONCAT71(uStack_47,local_48) & 0xfffffffffffffff0;
    fio_write2_fn(fd,options_00);
  }
  else {
    options.after.dealloc = FIO_DEALLOC_NOOP;
    options.data.buffer = anon_var_dwarf_3ab9b;
    options.length = 6;
    options.offset = 0;
    options._32_8_ = CONCAT71(uStack_1f,local_20) & 0xfffffffffffffff0;
    fio_write2_fn(fd,options);
  }
  return '\0';
}

Assistant:

static uint8_t on_shutdown(intptr_t fd, fio_protocol_s *ws) {
  (void)(fd);
  if (ws && ((ws_s *)ws)->on_shutdown)
    ((ws_s *)ws)->on_shutdown((ws_s *)ws);
  if (((ws_s *)ws)->is_client) {
    fio_write2(fd, .data.buffer = "\x8a\x80MASK", .length = 6,
               .after.dealloc = FIO_DEALLOC_NOOP);
  } else {
    fio_write2(fd, .data.buffer = "\x8a\x00", .length = 2,
               .after.dealloc = FIO_DEALLOC_NOOP);
  }
  return 0;
}